

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

MainFunc __thiscall capnp::compiler::CompilerMain::getGenIdMain(CompilerMain *this)

{
  StringPtr extendedDescription;
  Iface *pIVar1;
  Iface *extraout_RDX;
  _func_int **in_RSI;
  StringPtr version;
  MainFunc MVar2;
  StringPtr briefDescription;
  Function<kj::MainBuilder::Validity_()> local_40;
  MainBuilder local_30;
  char *local_20;
  undefined8 uStack_18;
  
  local_20 = "";
  uStack_18 = 1;
  extendedDescription.content.size_ = 1;
  extendedDescription.content.ptr = "";
  version.content.size_ = 0x1c;
  version.content.ptr = "Cap\'n Proto version 2.0-dev";
  briefDescription.content.size_ = 0x42;
  briefDescription.content.ptr =
       "Generates a new 64-bit unique ID for use in a Cap\'n Proto schema.";
  kj::MainBuilder::MainBuilder
            (&local_30,(ProcessContext *)in_RSI[1],version,briefDescription,extendedDescription);
  local_40.impl.ptr = (Iface *)operator_new(0x18);
  (local_40.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0027a698;
  local_40.impl.ptr[1]._vptr_Iface = in_RSI;
  local_40.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getGenIdMain()::{lambda(auto:1&,(auto:2&&)...)#1},capnp::compiler::CompilerMain::getGenIdMain()::{lambda(auto:1&,(auto:2&&)...)#2}>>>
        ::instance;
  kj::MainBuilder::callAfterParsing(&local_30,&local_40);
  MVar2 = kj::MainBuilder::build((MainBuilder *)this);
  pIVar1 = local_40.impl.ptr;
  if (local_40.impl.ptr != (Iface *)0x0) {
    local_40.impl.ptr = (Iface *)0x0;
    (**(local_40.impl.disposer)->_vptr_Disposer)
              (local_40.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface,
               MVar2.impl.ptr);
  }
  kj::MainBuilder::~MainBuilder(&local_30);
  MVar2.impl.ptr = extraout_RDX;
  MVar2.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar2.impl;
}

Assistant:

kj::MainFunc getGenIdMain() {
    return kj::MainBuilder(context, VERSION_STRING,
          "Generates a new 64-bit unique ID for use in a Cap'n Proto schema.")
        .callAfterParsing(KJ_BIND_METHOD(*this, generateId))
        .build();
  }